

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cpp
# Opt level: O2

void slang::iterDirectory
               (path *path,SmallVector<std::filesystem::__cxx11::path,_2UL> *results,GlobMode mode)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  directory_entry *pdVar3;
  path *args;
  directory_iterator it;
  error_code ec;
  path local_58;
  
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  if ((path->_M_pathname)._M_string_length == 0) {
    std::filesystem::__cxx11::path::path<char[2],std::filesystem::__cxx11::path>
              (&local_58,(char (*) [2])0x412016,auto_format);
  }
  else {
    std::filesystem::__cxx11::path::path(&local_58,path);
  }
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            (&it,&local_58,skip_permission_denied|follow_directory_symlink,&ec);
  std::filesystem::__cxx11::path::~path(&local_58);
  do {
    _Var1._M_pi = it._M_dir._M_refcount._M_pi;
    local_58._M_pathname._M_dataplus._M_p = (pointer)0x0;
    local_58._M_pathname._M_string_length = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_pathname._M_string_length)
    ;
    if (_Var1._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&it._M_dir._M_refcount);
      return;
    }
    if (mode == Directories) {
      pdVar3 = (directory_entry *)std::filesystem::__cxx11::directory_iterator::operator*(&it);
      bVar2 = std::filesystem::__cxx11::directory_entry::is_directory(pdVar3,&ec);
LAB_001a9bd6:
      if (bVar2 != false) {
        args = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&it);
        SmallVectorBase<std::filesystem::__cxx11::path>::
        emplace_back<std::filesystem::__cxx11::path_const&>
                  (&results->super_SmallVectorBase<std::filesystem::__cxx11::path>,args);
      }
    }
    else if (mode == Files) {
      pdVar3 = (directory_entry *)std::filesystem::__cxx11::directory_iterator::operator*(&it);
      bVar2 = std::filesystem::__cxx11::directory_entry::is_regular_file(pdVar3,&ec);
      goto LAB_001a9bd6;
    }
    std::filesystem::__cxx11::directory_iterator::increment((error_code *)&it);
  } while( true );
}

Assistant:

static void iterDirectory(const fs::path& path, SmallVector<fs::path>& results, GlobMode mode) {
    std::error_code ec;
    for (auto it = fs::directory_iterator(path.empty() ? "." : path,
                                          fs::directory_options::follow_directory_symlink |
                                              fs::directory_options::skip_permission_denied,
                                          ec);
         it != fs::directory_iterator(); it.increment(ec)) {
        if ((mode == GlobMode::Files && it->is_regular_file(ec)) ||
            (mode == GlobMode::Directories && it->is_directory(ec))) {
            results.emplace_back(it->path());
        }
    }
}